

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode
TTDHandleBreakpointInfoAndInflate
          (int64_t snapTime,JsrtRuntime *runtime,ThreadContext *threadContext)

{
  anon_class_16_2_8fba1e49 fn;
  JsErrorCode JVar1;
  ThreadContext *local_20;
  ThreadContext *threadContext_local;
  JsrtRuntime *runtime_local;
  int64_t snapTime_local;
  
  fn.snapTime = (int64_t *)&runtime_local;
  fn.threadContext = &local_20;
  local_20 = threadContext;
  threadContext_local = (ThreadContext *)runtime;
  runtime_local = (JsrtRuntime *)snapTime;
  JVar1 = GlobalAPIWrapper_NoRecord<TTDHandleBreakpointInfoAndInflate(long,JsrtRuntime*,ThreadContext*)::__0>
                    (fn);
  return JVar1;
}

Assistant:

JsErrorCode TTDHandleBreakpointInfoAndInflate(int64_t snapTime, JsrtRuntime* runtime, ThreadContext* threadContext)
{
    return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode
    {
        if(threadContext->TTDLog->IsDebugModeFlagSet())
        {
            threadContext->TTDExecutionInfo->LoadPreservedBPInfo(threadContext);
        }

        threadContext->TTDLog->DoSnapshotInflate(snapTime);

        threadContext->TTDLog->ResetCallStackForTopLevelCall(-1);
        if(threadContext->TTDExecutionInfo != nullptr)
        {
            threadContext->TTDExecutionInfo->ResetCallStackForTopLevelCall(-1);
        }

        return JsNoError;
    });
}